

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextVkImpl::UpdateTexture
          (DeviceContextVkImpl *this,ITexture *pTexture,Uint32 MipLevel,Uint32 Slice,Box *DstBox,
          TextureSubResData *SubresData,RESOURCE_STATE_TRANSITION_MODE SrcBufferStateTransitionMode,
          RESOURCE_STATE_TRANSITION_MODE TextureStateTransitionMode)

{
  string msg;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::UpdateTexture
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pTexture,MipLevel,Slice,DstBox,
             SubresData,SrcBufferStateTransitionMode,TextureStateTransitionMode);
  if (pTexture != (ITexture *)0x0) {
    CheckDynamicType<Diligent::TextureVkImpl,Diligent::ITexture>(pTexture);
  }
  if ((*(byte *)&pTexture[8].super_IDeviceObject.super_IObject._vptr_IObject | 4) != 5) {
    FormatString<char[80]>
              (&msg,(char (*) [80])
                    "Only USAGE_DEFAULT or USAGE_SPARSE textures should be updated with UpdateData()"
              );
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"UpdateTexture",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x91b);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if (SubresData->pSrcBuffer == (IBuffer *)0x0) {
    UpdateTextureRegion(this,SubresData->pData,SubresData->Stride,SubresData->DepthStride,
                        (TextureVkImpl *)pTexture,MipLevel,Slice,DstBox,TextureStateTransitionMode);
  }
  else {
    FormatString<char[45]>(&msg,(char (*) [45])"Copying buffer to texture is not implemented");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"UpdateTexture",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x91f);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void DeviceContextVkImpl::UpdateTexture(ITexture*                      pTexture,
                                        Uint32                         MipLevel,
                                        Uint32                         Slice,
                                        const Box&                     DstBox,
                                        const TextureSubResData&       SubresData,
                                        RESOURCE_STATE_TRANSITION_MODE SrcBufferStateTransitionMode,
                                        RESOURCE_STATE_TRANSITION_MODE TextureStateTransitionMode)
{
    TDeviceContextBase::UpdateTexture(pTexture, MipLevel, Slice, DstBox, SubresData, SrcBufferStateTransitionMode, TextureStateTransitionMode);

    TextureVkImpl* pTexVk = ClassPtrCast<TextureVkImpl>(pTexture);
    // OpenGL backend uses UpdateData() to initialize textures, so we can't check the usage in ValidateUpdateTextureParams()
    DEV_CHECK_ERR(pTexVk->GetDesc().Usage == USAGE_DEFAULT || pTexVk->GetDesc().Usage == USAGE_SPARSE,
                  "Only USAGE_DEFAULT or USAGE_SPARSE textures should be updated with UpdateData()");

    if (SubresData.pSrcBuffer != nullptr)
    {
        UNSUPPORTED("Copying buffer to texture is not implemented");
    }
    else
    {
        UpdateTextureRegion(SubresData.pData, SubresData.Stride, SubresData.DepthStride, *pTexVk,
                            MipLevel, Slice, DstBox, TextureStateTransitionMode);
    }
}